

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O0

void pzshape::TPZShapeTetra::ShapeInternal
               (TPZVec<double> *x,int order,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  undefined *puVar3;
  double *pdVar4;
  int in_ESI;
  TPZVec<double> *in_RDI;
  double dVar5;
  int k;
  int j;
  int i;
  int index;
  TPZFNMatrix<100,_double> dphi2;
  TPZFNMatrix<100,_double> dphi1;
  TPZFNMatrix<100,_double> dphi0;
  TPZFNMatrix<100,_double> phi2;
  TPZFNMatrix<100,_double> phi1;
  TPZFNMatrix<100,_double> phi0;
  int ord;
  double in_stack_ffffffffffffe860;
  double *in_stack_ffffffffffffe868;
  TPZFNMatrix<100,_double> *in_stack_ffffffffffffe870;
  int local_1698;
  int local_1694;
  int local_1690;
  undefined1 local_1688 [952];
  undefined1 local_12d0 [952];
  undefined1 local_f18 [952];
  undefined1 local_b60 [968];
  undefined1 local_798 [952];
  undefined1 local_3e0 [956];
  int local_24;
  TPZVec<double> *local_8;
  
  if (3 < in_ESI) {
    local_24 = in_ESI + -3;
    local_8 = in_RDI;
    TPZFNMatrix<100,_double>::TPZFNMatrix
              (in_stack_ffffffffffffe870,(int64_t)in_stack_ffffffffffffe868,
               (int64_t)in_stack_ffffffffffffe860);
    TPZFNMatrix<100,_double>::TPZFNMatrix
              (in_stack_ffffffffffffe870,(int64_t)in_stack_ffffffffffffe868,
               (int64_t)in_stack_ffffffffffffe860);
    TPZFNMatrix<100,_double>::TPZFNMatrix
              (in_stack_ffffffffffffe870,(int64_t)in_stack_ffffffffffffe868,
               (int64_t)in_stack_ffffffffffffe860);
    TPZFNMatrix<100,_double>::TPZFNMatrix
              (in_stack_ffffffffffffe870,(int64_t)in_stack_ffffffffffffe868,
               (int64_t)in_stack_ffffffffffffe860);
    TPZFNMatrix<100,_double>::TPZFNMatrix
              (in_stack_ffffffffffffe870,(int64_t)in_stack_ffffffffffffe868,
               (int64_t)in_stack_ffffffffffffe860);
    TPZFNMatrix<100,_double>::TPZFNMatrix
              (in_stack_ffffffffffffe870,(int64_t)in_stack_ffffffffffffe868,
               (int64_t)in_stack_ffffffffffffe860);
    puVar3 = TPZShapeLinear::fOrthogonal;
    pdVar4 = TPZVec<double>::operator[](local_8,0);
    (*(code *)puVar3)(*pdVar4 + *pdVar4 + -1.0,local_24,local_3e0,local_f18);
    puVar3 = TPZShapeLinear::fOrthogonal;
    pdVar4 = TPZVec<double>::operator[](local_8,1);
    (*(code *)puVar3)(*pdVar4 + *pdVar4 + -1.0,local_24,local_798,local_12d0);
    puVar3 = TPZShapeLinear::fOrthogonal;
    pdVar4 = TPZVec<double>::operator[](local_8,2);
    (*(code *)puVar3)(*pdVar4 + *pdVar4 + -1.0,local_24,local_b60,local_1688);
    for (local_1690 = 0; local_1690 < local_24; local_1690 = local_1690 + 1) {
      for (local_1694 = 0; local_1694 < local_24; local_1694 = local_1694 + 1) {
        for (local_1698 = 0; local_1698 < local_24; local_1698 = local_1698 + 1) {
          if (local_1690 + local_1694 + local_1698 < local_24) {
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe868,
                                (int64_t)in_stack_ffffffffffffe860);
            dVar5 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe868,
                                (int64_t)in_stack_ffffffffffffe860);
            dVar1 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe868,
                                (int64_t)in_stack_ffffffffffffe860);
            dVar2 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe868,
                                (int64_t)in_stack_ffffffffffffe860);
            *pdVar4 = dVar5 * dVar1 * dVar2;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe868,
                                (int64_t)in_stack_ffffffffffffe860);
            dVar5 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe868,
                                (int64_t)in_stack_ffffffffffffe860);
            dVar1 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe868,
                                (int64_t)in_stack_ffffffffffffe860);
            dVar2 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe868,
                                (int64_t)in_stack_ffffffffffffe860);
            *pdVar4 = (dVar5 + dVar5) * dVar1 * dVar2;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe868,
                                (int64_t)in_stack_ffffffffffffe860);
            dVar5 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe868,
                                (int64_t)in_stack_ffffffffffffe860);
            dVar1 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe868,
                                (int64_t)in_stack_ffffffffffffe860);
            dVar2 = *pdVar4;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe868,
                                (int64_t)in_stack_ffffffffffffe860);
            *pdVar4 = (dVar5 + dVar5) * dVar1 * dVar2;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe868,
                                (int64_t)in_stack_ffffffffffffe860);
            in_stack_ffffffffffffe870 = (TPZFNMatrix<100,_double> *)(*pdVar4 + *pdVar4);
            pdVar4 = TPZFMatrix<double>::operator()
                               ((TPZFMatrix<double> *)in_stack_ffffffffffffe870,
                                (int64_t)in_stack_ffffffffffffe868,
                                (int64_t)in_stack_ffffffffffffe860);
            in_stack_ffffffffffffe860 = (double)in_stack_ffffffffffffe870 * *pdVar4;
            in_stack_ffffffffffffe868 =
                 TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860);
            dVar5 = in_stack_ffffffffffffe860 * *in_stack_ffffffffffffe868;
            pdVar4 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe868,
                                (int64_t)in_stack_ffffffffffffe860);
            *pdVar4 = dVar5;
          }
        }
      }
    }
    TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18964e1);
    TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18964ee);
    TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18964fb);
    TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x1896508);
    TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x1896515);
    TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x1896522);
  }
  return;
}

Assistant:

void TPZShapeTetra::ShapeInternal(TPZVec<REAL> &x, int order,TPZFMatrix<REAL> &phi,
									  TPZFMatrix<REAL> &dphi) {
		if(order < 4) return;
		int ord = order-3;
		
		TPZFNMatrix<100, REAL> phi0(ord,1),phi1(ord,1),phi2(ord,1),dphi0(1,ord),dphi1(1,ord),dphi2(1,ord);
        TPZShapeLinear::fOrthogonal(2.*x[0]-1.,ord,phi0,dphi0);
        TPZShapeLinear::fOrthogonal(2.*x[1]-1.,ord,phi1,dphi1);
        TPZShapeLinear::fOrthogonal(2.*x[2]-1.,ord,phi2,dphi2);
        
        
		int index = 0;
		for (int i=0;i<ord;i++) {
			for (int j=0;j<ord;j++) {
				for (int k=0;k<ord;k++) {
					if( i+j+k < ord ) {
						//int index = ord*(ord*i+j)+k;
						phi(index,0) =  phi0(i,0)* phi1(j,0)* phi2(k,0);
						dphi(0,index) =  2.*dphi0(0,i)* phi1(j,0)* phi2(k,0);
						dphi(1,index) =  2.* phi0(i,0)*dphi1(0,j)* phi2(k,0);
						dphi(2,index) =  2.* phi0(i,0)* phi1(j,0)*dphi2(0,k);
						index++;
					}
				}
			}
		}
	}